

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatrix<long>::AutoFill(TPZMatrix<long> *this,int64_t nrow,int64_t ncol,int symmetric)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar3;
  long lVar4;
  long lVar5;
  long val;
  long local_60;
  int local_54;
  long local_50;
  double local_48;
  undefined8 uStack_40;
  
  local_54 = symmetric;
  (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xd])();
  if (0 < (this->super_TPZBaseMatrix).fRow) {
    lVar5 = 0;
    do {
      if (lVar5 == 0 || local_54 == 0) {
        lVar3 = 0;
        lVar4 = 0;
      }
      else {
        lVar4 = 0;
        lVar3 = 0;
        do {
          iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                            (this,lVar3,lVar5);
          local_60 = CONCAT44(extraout_var,iVar2);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,lVar5,lVar3,&local_60);
          iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                            (this,lVar5,lVar3);
          lVar4 = (long)((double)lVar4 + ABS((double)CONCAT44(extraout_var_00,iVar2)));
          lVar3 = lVar3 + 1;
        } while (lVar5 != lVar3);
      }
      for (; lVar1 = (this->super_TPZBaseMatrix).fCol, lVar3 < lVar1; lVar3 = lVar3 + 1) {
        iVar2 = rand();
        iVar2 = (int)((long)iVar2 * 0x40000001 >> 0x3d) - (iVar2 >> 0x1f);
        local_50 = (long)iVar2;
        if (lVar5 != lVar3) {
          lVar4 = (long)((double)lVar4 + ABS((double)iVar2));
        }
        iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                          (this,lVar5,lVar3,&local_50);
        if (iVar2 == 0) {
          Error("AutoFill (TPZMatrix) failed.",(char *)0x0);
        }
      }
      if ((this->super_TPZBaseMatrix).fRow == lVar1) {
        local_48 = ABS((double)lVar4);
        uStack_40 = 0;
        iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (this,lVar5,lVar5);
        if (ABS((double)CONCAT44(extraout_var_01,iVar2)) < local_48) {
          local_60 = lVar4 + 1;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,lVar5,lVar5,&local_60);
        }
        if ((lVar4 == 0) &&
           (iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                              (this,lVar5,lVar5), CONCAT44(extraout_var_02,iVar2) == 0)) {
          local_60 = 1;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,lVar5,lVar5,&local_60);
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < (this->super_TPZBaseMatrix).fRow);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::AutoFill(int64_t nrow, int64_t ncol, int symmetric) {
    Resize(nrow,ncol);
	int64_t i, j;
	TVar val, sum;
	/** Fill data */
	for(i=0;i<Rows();i++) {
		sum = 0.0;
        j=0;
        if (symmetric) {
            for (; j<i; j++) {
                if constexpr (is_complex<TVar>::value){
                    //hermitian matrices
                    PutVal(i, j, std::conj(GetVal(j,i)));
                }else{
                    PutVal(i, j, GetVal(j,i));
                }
                sum += fabs(GetVal(i, j));
            }
        }
		for(;j<Cols();j++) {
			val = GetRandomVal();
            if constexpr(is_complex<TVar>::value){
                if(j==i) val = fabs(val);
            }
            if(i!=j) sum += fabs(val);
			if(!PutVal(i,j,val))
				Error("AutoFill (TPZMatrix) failed.");
			
		}
		if (Rows() == Cols()) {
		  /** Making diagonally dominant and non zero in diagonal */
		  if(fabs(sum) > fabs(GetVal(i,i)))            // Deve satisfazer:  |Aii| > SUM( |Aij| )  sobre j != i
			  PutVal(i,i,sum+(TVar)1.);
		  // To sure diagonal is not zero.
		  if(IsZero(sum) && IsZero(GetVal(i,i)))
			  PutVal(i,i,1.);
		}
	}
}